

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qminimalflatset_p.h
# Opt level: O2

pair<QWindow_*const_*,_bool> __thiscall
QMinimalFlatSet<QWindow_*,_QVarLengthArray<QWindow_*,_20LL>,_std::less<QWindow_*>_>::insert
          (QMinimalFlatSet<QWindow_*,_QVarLengthArray<QWindow_*,_20LL>,_std::less<QWindow_*>_> *this
          ,value_type *v)

{
  const_iterator before;
  undefined8 extraout_RDX;
  undefined8 uVar1;
  R_conflict RVar2;
  pair<QWindow_*const_*,_bool> pVar3;
  
  RVar2 = lookup(this,v);
  before = RVar2.it;
  if (((undefined1  [16])RVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    before = QVarLengthArray<QWindow_*,_20LL>::insert(&this->c,before,v);
    uVar1 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
  }
  else {
    uVar1 = 0;
  }
  pVar3._8_8_ = uVar1;
  pVar3.first = before;
  return pVar3;
}

Assistant:

std::pair<iterator, bool> insert(const value_type &v)
    {
        QMINIMAL_FLAT_SET_PRINT_AT_END
        const auto r = lookup(v);
        if (r.exists)
            return {r.it, false};
        else
            return {c.insert(r.it, v), true};
    }